

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reporter.cc
# Opt level: O2

void benchmark::BenchmarkReporter::PrintBasicContext(ostream *out_ptr,Context *context)

{
  ostream *poVar1;
  char *pcVar2;
  CheckHandler local_40;
  string local_38 [32];
  
  if (out_ptr == (ostream *)0x0) {
    internal::CheckHandler::CheckHandler
              (&local_40,"out_ptr",
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/reporter.cc"
               ,"PrintBasicContext",0x27);
  }
  else {
    local_40.log_ = internal::GetNullLogInstance();
  }
  std::operator<<(local_40.log_,"cannot be null");
  if (out_ptr != (ostream *)0x0) {
    poVar1 = std::operator<<(out_ptr,"Run on (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,context->num_cpus);
    std::operator<<(poVar1," X ");
    poVar1 = std::ostream::_M_insert<double>(context->mhz_per_cpu);
    poVar1 = std::operator<<(poVar1," MHz CPU ");
    pcVar2 = "";
    if (1 < context->num_cpus) {
      pcVar2 = "s";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::operator<<(poVar1,")\n");
    LocalDateTimeString_abi_cxx11_();
    poVar1 = std::operator<<(out_ptr,local_38);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string(local_38);
    if (context->cpu_scaling_enabled == true) {
      std::operator<<(out_ptr,
                      "***WARNING*** CPU scaling is enabled, the benchmark real time measurements may be noisy and will incur extra overhead.\n"
                     );
    }
    std::operator<<(out_ptr,"***WARNING*** Library was built as DEBUG. Timings may be affected.\n");
    return;
  }
  internal::CheckHandler::~CheckHandler(&local_40);
}

Assistant:

void BenchmarkReporter::PrintBasicContext(std::ostream *out_ptr,
                                          Context const &context) {
  CHECK(out_ptr) << "cannot be null";
  auto& Out = *out_ptr;

  Out << "Run on (" << context.num_cpus << " X " << context.mhz_per_cpu
            << " MHz CPU " << ((context.num_cpus > 1) ? "s" : "") << ")\n";

  Out << LocalDateTimeString() << "\n";

  if (context.cpu_scaling_enabled) {
    Out << "***WARNING*** CPU scaling is enabled, the benchmark "
                 "real time measurements may be noisy and will incur extra "
                 "overhead.\n";
  }

#ifndef NDEBUG
  Out << "***WARNING*** Library was built as DEBUG. Timings may be "
               "affected.\n";
#endif
}